

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.cpp
# Opt level: O2

void __thiscall amrex::ForkJoin::copy_data_from_tasks(ForkJoin *this)

{
  int dcomp;
  FabArray<amrex::FArrayBox> *this_00;
  ostream *poVar1;
  Print *pPVar2;
  __node_base *p_Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  _Hash_node_base *p_Var8;
  ostringstream *this_01;
  Print local_1b8;
  
  if (this->flag_verbose == true) {
    poVar1 = OutStream();
    Print::Print(&local_1b8,poVar1);
    std::operator<<((ostream *)&local_1b8.ss,"Copying data out of fork-join tasks ...\n");
    Print::~Print(&local_1b8);
  }
  p_Var3 = &(this->data)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    lVar5 = 0;
    while( true ) {
      p_Var8 = p_Var3[5]._M_nxt;
      if (((long)p_Var3[6]._M_nxt - (long)p_Var8) / 0x50 <= lVar5) break;
      if (*(int *)((long)&p_Var8[lVar5 * 10 + 1]._M_nxt + 4) - 1U < 2) {
        p_Var8 = p_Var8 + lVar5 * 10;
        this_00 = (FabArray<amrex::FArrayBox> *)p_Var8->_M_nxt;
        if (*(int *)&p_Var8[1]._M_nxt == 2) {
          lVar7 = 4;
          lVar6 = 0;
          for (lVar4 = 0;
              lVar4 < ((long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->split_bounds).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x20;
              lVar4 = lVar4 + 1) {
            if (this->flag_verbose == true) {
              poVar1 = OutStream();
              Print::Print(&local_1b8,poVar1);
              std::operator<<((ostream *)&local_1b8.ss,"  Copying ");
              std::operator<<((ostream *)&local_1b8.ss,(string *)(p_Var3 + 1));
              std::operator<<((ostream *)&local_1b8.ss,"[");
              std::ostream::operator<<(&local_1b8.ss,(int)lVar5);
              std::operator<<((ostream *)&local_1b8.ss,"] components [");
              pPVar2 = Print::operator<<(&local_1b8,(int *)((long)p_Var8[4]._M_nxt + lVar7 + -4));
              std::operator<<((ostream *)&pPVar2->ss,", ");
              pPVar2 = Print::operator<<(pPVar2,(int *)((long)&(p_Var8[4]._M_nxt)->_M_nxt + lVar7));
              this_01 = &pPVar2->ss;
              std::operator<<((ostream *)this_01,") out from task ");
              std::ostream::operator<<(this_01,(int)lVar4);
              std::operator<<((ostream *)this_01," (unsplit)");
              std::endl<char,std::char_traits<char>>((ostream *)this_01);
              Print::~Print(&local_1b8);
            }
            dcomp = *(int *)((long)p_Var8[4]._M_nxt + lVar7 + -4);
            FabArray<amrex::FArrayBox>::Redistribute
                      (this_00,(FabArray<amrex::FArrayBox> *)
                               ((long)&(p_Var8[7]._M_nxt)->_M_nxt + lVar6),0,dcomp,
                       *(int *)((long)&(p_Var8[4]._M_nxt)->_M_nxt + lVar7) - dcomp,
                       (IntVect *)((long)&p_Var8[2]._M_nxt + 4));
            lVar6 = lVar6 + 0x180;
            lVar7 = lVar7 + 8;
          }
        }
        else {
          if (this->flag_verbose == true) {
            poVar1 = OutStream();
            Print::Print(&local_1b8,poVar1);
            std::operator<<((ostream *)&local_1b8.ss,"Copying ");
            std::operator<<((ostream *)&local_1b8.ss,(string *)(p_Var3 + 1));
            std::operator<<((ostream *)&local_1b8.ss," out from task ");
            pPVar2 = Print::operator<<(&local_1b8,(int *)(p_Var8 + 2));
            std::operator<<((ostream *)&pPVar2->ss," (whole)");
            std::endl<char,std::char_traits<char>>((ostream *)&pPVar2->ss);
            Print::~Print(&local_1b8);
          }
          FabArray<amrex::FArrayBox>::Redistribute
                    (this_00,(FabArray<amrex::FArrayBox> *)
                             (p_Var8[7]._M_nxt + (long)*(int *)&p_Var8[2]._M_nxt * 0x30),0,0,
                     (this_00->super_FabArrayBase).n_comp,(IntVect *)((long)&p_Var8[2]._M_nxt + 4));
        }
      }
      lVar5 = lVar5 + 1;
    }
  }
  return;
}

Assistant:

void
ForkJoin::copy_data_from_tasks ()
{
    BL_PROFILE("ForkJoin::copy_data_from_tasks()");
    if (flag_verbose) {
        amrex::Print() << "Copying data out of fork-join tasks ...\n";
    }
    for (auto &p : data) { // for each name
        const auto &mf_name = p.first;
        for (int idx = 0; idx < p.second.size(); ++idx) { // for each index
            auto &mff = p.second[idx];
            if (mff.intent == Intent::out || mff.intent == Intent::inout) {
                MultiFab &orig = *mff.orig;
                const auto &comp_split = mff.comp_split;
                const Vector<MultiFab> &forked = mff.forked;
                if (mff.strategy == Strategy::split) {
                    // gather components from across tasks
                    for (int i = 0; i < NTasks(); ++i) {
                        if (flag_verbose) {
                            amrex::Print() << "  Copying " << mf_name << "[" << idx << "] components ["
                                           << comp_split[i].lo << ", " << comp_split[i].hi << ") out from task " << i << " (unsplit)" << std::endl;
                        }
                        int task_comp_n = comp_split[i].hi - comp_split[i].lo;
                        AMREX_ASSERT(forked[i].nComp() == task_comp_n);
                        orig.Redistribute(forked[i], 0, comp_split[i].lo, task_comp_n, mff.ngrow);
                    }
                } else { // mff.strategy == single or duplicate
                    // copy all components from owner_task
                    if (flag_verbose) {
                        amrex::Print() << "Copying " << mf_name << " out from task " << mff.owner_task << " (whole)" << std::endl;
                    }
                    AMREX_ASSERT(forked[mff.owner_task].nComp() == orig.nComp());
                    orig.Redistribute(forked[mff.owner_task], 0, 0, orig.nComp(), mff.ngrow);
                }
            }
        }
    }
}